

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

bool ConvolutionReverb_UploadSample
               (int index,float *data,int numsamples,int numchannels,int samplerate,char *name)

{
  undefined8 *puVar1;
  long lVar2;
  void *__dest;
  ulong __n;
  MutexScopeLock mutexScope;
  MutexScopeLock local_48;
  char *local_40;
  float *local_38;
  
  if ((uint)index < 0x10) {
    local_48.mutex = (Mutex *)ConvolutionReverb::sampleMutex;
    local_40 = name;
    local_38 = data;
    Mutex::Lock((Mutex *)ConvolutionReverb::sampleMutex);
    if (ConvolutionReverb::GetIRSample(int)::initialized == '\0') {
      memset(ConvolutionReverb::GetIRSample(int)::samples,0,0x4200);
      ConvolutionReverb::GetIRSample(int)::initialized = '\x01';
    }
    lVar2 = (ulong)(uint)index * 0x420;
    puVar1 = (undefined8 *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2);
    if ((*(int *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x18) != 0) &&
       ((void *)*puVar1 != (void *)0x0)) {
      operator_delete__((void *)*puVar1);
    }
    if (numchannels * numsamples < 1) {
      *puVar1 = 0;
      *(undefined4 *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x18) = 1;
    }
    else {
      __n = (ulong)(uint)(numchannels * numsamples) << 2;
      __dest = operator_new__(__n);
      *puVar1 = __dest;
      *(undefined4 *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x18) = 1;
      strcpy(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x1c,local_40);
      memcpy(__dest,local_38,__n);
    }
    *(int *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 8) = numsamples;
    *(int *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0xc) = numchannels;
    *(int *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x10) = samplerate;
    ConvolutionReverb::globalupdatecount = ConvolutionReverb::globalupdatecount + 1;
    *(int *)(ConvolutionReverb::GetIRSample(int)::samples + lVar2 + 0x14) =
         ConvolutionReverb::globalupdatecount;
    MutexScopeLock::~MutexScopeLock(&local_48);
  }
  return (uint)index < 0x10;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API bool ConvolutionReverb_UploadSample(int index, float* data, int numsamples, int numchannels, int samplerate, const char* name)
{
    if (index < 0 || index >= ConvolutionReverb::MAXSAMPLE)
        return false;
    MutexScopeLock mutexScope(ConvolutionReverb::sampleMutex);
    ConvolutionReverb::IRSample& s = ConvolutionReverb::GetIRSample(index);
    if (s.allocated)
        delete[] s.data;
    int num = numsamples * numchannels;
    if (num > 0)
    {
        s.data = new float[num];
        s.allocated = 1;
        strcpy_s(s.name, name);
        memcpy(s.data, data, numsamples * numchannels * sizeof(float));
    }
    else
    {
        s.data = NULL;
        s.allocated = 1;
    }
    s.numsamples = numsamples;
    s.numchannels = numchannels;
    s.samplerate = samplerate;
    s.updatecount = ++ConvolutionReverb::globalupdatecount;
    return true;
}